

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
          (RepeatedImmutableMessageFieldGenerator *this,Printer *printer,char *method_prototype,
          char *regular_case,char *nested_builder_case,char *trailing_code)

{
  RepeatedImmutableMessageFieldGenerator *in_RCX;
  char *in_RDI;
  Printer *in_R8;
  char *in_R9;
  char *in_stack_000001b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001b8;
  Printer *in_stack_000001c0;
  
  io::Printer::Print(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)method_prototype,regular_case,nested_builder_case,
             (FieldDescriptor *)trailing_code);
  io::Printer::Print<>((Printer *)method_prototype,regular_case);
  io::Printer::Indent((Printer *)0x58f819);
  PrintNestedBuilderCondition(in_RCX,in_R8,in_R9,in_RDI);
  if (in_R9 != (char *)0x0) {
    io::Printer::Print(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
  }
  io::Printer::Outdent((Printer *)this);
  io::Printer::Print<>((Printer *)method_prototype,regular_case);
  return;
}

Assistant:

void RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction(
    io::Printer* printer, const char* method_prototype,
    const char* regular_case, const char* nested_builder_case,
    const char* trailing_code) const {
  printer->Print(variables_, method_prototype);
  printer->Annotate("{", "}", descriptor_);
  printer->Print(" {\n");
  printer->Indent();
  PrintNestedBuilderCondition(printer, regular_case, nested_builder_case);
  if (trailing_code != NULL) {
    printer->Print(variables_, trailing_code);
  }
  printer->Outdent();
  printer->Print("}\n");
}